

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManProfileTruths(Mf_Man_t *p)

{
  int *piVar1;
  int iVar2;
  Vec_Mem_t *pVVar3;
  int iVar4;
  void *__s;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  iVar2 = (p->vCnfSizes).nSize;
  iVar4 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar4 = iVar2;
  }
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
  }
  memset(__s,0,(long)iVar2 * 4);
  uVar5 = (ulong)p->pGia->nObjs;
  if (0 < (long)uVar5) {
    pGVar6 = p->pGia->pObjs;
    lVar7 = 0;
    uVar8 = 0;
    do {
      if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
         (0xffff < *(uint *)(&p->pLfObjs->field_0xc + lVar7))) {
        uVar9 = *(uint *)((long)&p->pLfObjs->iCutSet + lVar7);
        uVar10 = (int)uVar9 >> 0x10;
        if (((int)uVar10 < 0) || ((p->vPages).nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar9 = *(uint *)((long)(p->vPages).pArray[uVar10] + (ulong)(uVar9 & 0xffff) * 4 + 4) >> 6;
        if (iVar2 <= (int)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)__s + (ulong)uVar9 * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar8 = uVar8 + 1;
      pGVar6 = pGVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < uVar5);
  }
  if (iVar2 < 1) {
    if (__s == (void *)0x0) {
      return;
    }
  }
  else {
    uVar5 = 0;
    uVar9 = 0;
    do {
      uVar10 = *(uint *)((long)__s + uVar5 * 4);
      if (uVar10 != 0) {
        printf("%6d : ",(ulong)uVar9);
        printf("%6d : ",uVar5 & 0xffffffff);
        printf("Occur = %4d  ",(ulong)uVar10);
        if ((long)(p->vCnfSizes).nSize <= (long)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("CNF size = %2d  ",(ulong)(uint)(p->vCnfSizes).pArray[uVar5]);
        pVVar3 = p->vTtMem;
        if ((long)pVVar3->nEntries <= (long)uVar5) {
          __assert_fail("i >= 0 && i < p->nEntries",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                        ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
        }
        uVar9 = uVar9 + 1;
        Dau_DsdPrintFromTruth
                  (pVVar3->ppPages[(uint)uVar5 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                   (long)(int)(pVVar3->PageMask & (uint)uVar5) * (long)pVVar3->nEntrySize,
                   p->pPars->nLutSize);
      }
      uVar5 = uVar5 + 1;
    } while ((long)iVar2 != uVar5);
  }
  free(__s);
  return;
}

Assistant:

void Mf_ManProfileTruths( Mf_Man_t * p )
{
    Vec_Int_t * vCounts;
    int i, Entry, * pCut, Counter = 0;
    vCounts = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntAddToEntry( vCounts, Abc_Lit2Var(Mf_CutFunc(pCut)), 1 );
    }
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( Entry == 0 )
            continue;
        printf( "%6d : ", Counter++ );
        printf( "%6d : ", i );
        printf( "Occur = %4d  ", Entry ); 
        printf( "CNF size = %2d  ", Vec_IntEntry(&p->vCnfSizes, i) );
        Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, i), p->pPars->nLutSize );
    }
    Vec_IntFree( vCounts );
}